

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rungame.c
# Opt level: O3

void describe_game(char *buf,nh_log_status status,nh_game_info_conflict *gi)

{
  nh_game_modes nVar1;
  char *__format;
  char *pcVar2;
  ulong uVar3;
  char *pcVar4;
  
  switch(status) {
  case LS_SAVED:
    pcVar4 = " with the amulet";
    if (gi->has_amulet == '\0') {
      pcVar4 = "";
    }
    pcVar2 = gi->level_desc;
    uVar3 = (ulong)(uint)gi->moves;
    __format = "%s\t%3.3s-%3.3s-%3.3s-%3.3s %s%s\tafter %d moves%s";
    goto LAB_0011612a;
  case LS_DONE:
    pcVar2 = gi->death;
    pcVar4 = (char *)(ulong)(uint)gi->moves;
    __format = "%s\t%3.3s-%3.3s-%3.3s-%3.3s %s\tafter %d moves%s";
    uVar3 = *(ulong *)(&DAT_00124b30 + (ulong)gi->playmode * 8);
LAB_0011612a:
    snprintf(buf,0x100,__format,gi->name,gi->plrole,gi->plrace,gi->plgend,gi->plalign,pcVar2,pcVar4,
             uVar3);
    return;
  case LS_IN_PROGRESS:
    nVar1 = gi->playmode;
    pcVar2 = "    %s\t%3.3s-%3.3s-%3.3s-%3.3s  (in progress)\t%s";
    break;
  case LS_CRASHED:
    nVar1 = gi->playmode;
    pcVar2 = "%s\t%3.3s-%3.3s-%3.3s-%3.3s  (crashed)\t%s";
    break;
  default:
    *buf = '\0';
    return;
  }
  snprintf(buf,0x100,pcVar2,gi->name,gi->plrole,gi->plrace,gi->plgend,gi->plalign,
           *(undefined8 *)(&DAT_00124b30 + (ulong)nVar1 * 8));
  return;
}

Assistant:

void describe_game(char *buf, enum nh_log_status status, struct nh_game_info *gi)
{
    const char *mode_desc[] = {"", "\t[tutorial]", "\t[explore]", "\t[wizard]"};
    switch (status) {
	case LS_CRASHED:
	    snprintf(buf, BUFSZ, "%s\t%3.3s-%3.3s-%3.3s-%3.3s  (crashed)\t%s",
		    gi->name, gi->plrole, gi->plrace, gi->plgend, gi->plalign,
		    mode_desc[gi->playmode]);
	    break;
	    
	case LS_IN_PROGRESS:
	    snprintf(buf, BUFSZ, "    %s\t%3.3s-%3.3s-%3.3s-%3.3s  (in progress)\t%s",
		    gi->name, gi->plrole, gi->plrace, gi->plgend, gi->plalign,
		    mode_desc[gi->playmode]);
	    break;
	    
	case LS_SAVED:
	    snprintf(buf, BUFSZ, "%s\t%3.3s-%3.3s-%3.3s-%3.3s %s%s\tafter %d moves%s",
		    gi->name, gi->plrole, gi->plrace, gi->plgend, gi->plalign,
		    gi->level_desc, gi->has_amulet ? " with the amulet" : "",
		    gi->moves, mode_desc[gi->playmode]);
	    break;
	    
	case LS_DONE:
	    snprintf(buf, BUFSZ, "%s\t%3.3s-%3.3s-%3.3s-%3.3s %s\tafter %d moves%s",
		    gi->name, gi->plrole, gi->plrace, gi->plgend, gi->plalign,
		    gi->death, gi->moves, mode_desc[gi->playmode]);
	    break;
	    
	    
	default:
	    buf[0] = '\0';
	    break;
    }
}